

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_cp_setfromcox(jpc_dec_cp_t *cp,jpc_dec_ccp_t *ccp,jpc_coxcp_t *compparms,int flags)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  
  iVar2 = (int)in_RAX;
  if ((((ulong)compparms & 4) != 0) || ((cp->flags & 4) == 0)) {
    cp->field_0x5 = *(char *)((long)&ccp->flags + 1) + '\x01';
    cp->field_0x6 = *(char *)((long)&ccp->flags + 2) + '\x02';
    cp->field_0x7 = *(char *)((long)&ccp->flags + 3) + '\x02';
    *(uint_fast8_t *)&cp->pchglist = ccp->numrlvls;
    *(uint_fast8_t *)((long)&cp[0x11].pchglist + 2) = ccp->csty;
    uVar3 = CONCAT71((int7)((ulong)in_RAX >> 8),(char)ccp->flags) & 0xffffffffffffff01;
    cp->field_0x4 = (char)uVar3;
    iVar2._0_1_ = ccp->qmfbid;
    iVar2._1_1_ = ccp->qsty;
    iVar2._2_2_ = *(undefined2 *)&ccp->field_0xa;
    if (0 < iVar2) {
      uVar3 = 0;
      do {
        *(undefined1 *)((long)&cp[0x11].pchglist + uVar3 + 3) =
             *(undefined1 *)((long)ccp->stepsizes + uVar3 * 2 + -0xc);
        *(undefined1 *)((long)&cp[0x11].ccps + uVar3 + 4) =
             *(undefined1 *)((long)ccp->stepsizes + uVar3 * 2 + -0xb);
        uVar3 = uVar3 + 1;
        iVar1._0_1_ = ccp->qmfbid;
        iVar1._1_1_ = ccp->qsty;
        iVar1._2_2_ = *(undefined2 *)&ccp->field_0xa;
      } while ((long)uVar3 < (long)iVar1);
    }
    iVar2 = (int)uVar3;
    cp->flags = (uint)compparms | cp->flags | 1;
  }
  return iVar2;
}

Assistant:

static int jpc_dec_cp_setfromcox(jpc_dec_cp_t *cp, jpc_dec_ccp_t *ccp,
  jpc_coxcp_t *compparms, int flags)
{
	int rlvlno;

	/* Eliminate compiler warnings about unused variables. */
	(void)cp;

	if ((flags & JPC_COC) || !(ccp->flags & JPC_COC)) {
		ccp->numrlvls = compparms->numdlvls + 1;
		ccp->cblkwidthexpn = JPC_COX_GETCBLKSIZEEXPN(
		  compparms->cblkwidthval);
		ccp->cblkheightexpn = JPC_COX_GETCBLKSIZEEXPN(
		  compparms->cblkheightval);
		ccp->qmfbid = compparms->qmfbid;
		ccp->cblkctx = compparms->cblksty;
		ccp->csty = compparms->csty & JPC_COX_PRT;
		for (rlvlno = 0; rlvlno < compparms->numrlvls; ++rlvlno) {
			ccp->prcwidthexpns[rlvlno] =
			  compparms->rlvls[rlvlno].parwidthval;
			ccp->prcheightexpns[rlvlno] =
			  compparms->rlvls[rlvlno].parheightval;
		}
		ccp->flags |= flags | JPC_CSET;
	}
	return 0;
}